

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O1

char * __thiscall deqp::gls::LineStream::str(LineStream *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_string,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return (this->m_string)._M_dataplus._M_p;
}

Assistant:

const char*			str				(void) const		{ m_string = m_stream.str(); return m_string.c_str(); }